

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O1

void __thiscall SAUF<TTA>::PerformLabeling(SAUF<TTA> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar9 = *(uint *)&pMVar4->field_0x8;
  uVar11 = *(uint *)&pMVar4->field_0xc;
  cv::Mat::Mat(local_b8,**(int **)&pMVar4->field_0x40,(*(int **)&pMVar4->field_0x40)[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  TTA::Alloc(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) * ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1
            );
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < (int)uVar9) {
    lVar13 = -1;
    uVar16 = 0;
    do {
      if (0 < (int)uVar11) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar10 = *(long *)&pMVar4->field_0x10;
        lVar6 = **(long **)&pMVar4->field_0x48;
        lVar12 = *(long *)&pMVar5->field_0x10;
        lVar17 = **(long **)&pMVar5->field_0x48;
        lVar1 = lVar12 + lVar17 * uVar16;
        lVar14 = lVar1 + -4;
        lVar12 = lVar12 + lVar17 * lVar13;
        lVar17 = lVar6 * lVar13 + lVar10;
        lVar10 = lVar6 * uVar16 + lVar10;
        uVar15 = 0;
        do {
          if (*(char *)(lVar10 + uVar15) != '\0') {
            if ((uVar16 == 0) || (*(char *)(lVar17 + uVar15) == '\0')) {
              if ((uVar16 == 0) ||
                 (((long)(int)uVar11 + -1 <= (long)uVar15 ||
                  (*(char *)(lVar17 + 1 + uVar15) == '\0')))) {
                if ((uVar15 == 0 || uVar16 == 0) || (*(char *)(lVar17 + -1 + uVar15) == '\0')) {
                  if ((uVar15 == 0) || (*(char *)(lVar10 + -1 + uVar15) == '\0')) {
                    TTA::rtable_[TTA::length_] = TTA::length_;
                    TTA::next_[TTA::length_] = 0xffffffff;
                    TTA::tail_[TTA::length_] = TTA::length_;
                    uVar8 = TTA::length_;
                    TTA::length_ = TTA::length_ + 1;
                  }
                  else {
                    uVar8 = *(uint *)(lVar14 + uVar15 * 4);
                  }
                }
                else {
                  uVar8 = *(uint *)(lVar12 + -4 + uVar15 * 4);
                }
              }
              else if (uVar15 == 0) {
LAB_001c557a:
                uVar8 = *(uint *)(lVar12 + 4 + uVar15 * 4);
              }
              else {
                if (*(char *)(lVar17 + -1 + uVar15) == '\0') {
                  if (*(char *)(lVar10 + -1 + uVar15) == '\0') goto LAB_001c557a;
                  uVar8 = *(uint *)(lVar14 + uVar15 * 4);
                }
                else {
                  uVar8 = *(uint *)(lVar12 + -4 + uVar15 * 4);
                }
                uVar8 = TTA::Merge(uVar8,*(uint *)(lVar12 + 4 + uVar15 * 4));
              }
            }
            else {
              uVar8 = *(uint *)(lVar12 + uVar15 * 4);
            }
            *(uint *)(lVar1 + uVar15 * 4) = uVar8;
          }
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      uVar16 = uVar16 + 1;
      lVar13 = lVar13 + 1;
    } while (uVar16 != uVar9);
  }
  puVar7 = TTA::rtable_;
  uVar9 = 1;
  if (1 < TTA::length_) {
    uVar9 = 1;
    uVar16 = 1;
    do {
      if (uVar16 == puVar7[uVar16]) {
        uVar9 = uVar9 + 1;
        uVar11 = uVar9;
      }
      else {
        uVar11 = puVar7[puVar7[uVar16]];
      }
      puVar7[uVar16] = uVar11;
      uVar16 = uVar16 + 1;
    } while (uVar16 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar7 = TTA::rtable_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar5->field_0x8) {
    lVar13 = *(long *)&pMVar5->field_0x10;
    lVar1 = **(long **)&pMVar5->field_0x48;
    lVar12 = 0;
    do {
      iVar2 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar2 != 0) {
        lVar10 = 0;
        do {
          *(uint *)(lVar13 + lVar10) = puVar7[*(uint *)(lVar13 + lVar10)];
          lVar10 = lVar10 + 4;
        } while ((long)iVar2 * 4 != lVar10);
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + lVar1;
    } while (lVar12 < *(int *)&pMVar5->field_0x8);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }